

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O3

int normal_scanPercent(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  XML_Convert_Result XVar2;
  ulong uVar3;
  char **ppcVar4;
  long lVar5;
  unsigned_short **ppuVar6;
  uint uVar7;
  char *pcVar8;
  int iVar9;
  int iVar10;
  unsigned_short *in_R8;
  
  ppcVar4 = (char **)(end + -(long)ptr);
  if ((long)ppcVar4 < 1) {
    return -1;
  }
  bVar1 = *(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr);
  iVar9 = 0;
  uVar7 = bVar1 - 5;
  if (uVar7 < 0x14) {
    pcVar8 = (char *)((long)&switchD_00487c47::switchdataD_0058e160 +
                     (long)(int)(&switchD_00487c47::switchdataD_0058e160)[uVar7]);
    iVar10 = 0;
    switch((uint)bVar1) {
    case 5:
      iVar10 = -2;
      if (ppcVar4 != (char **)0x1) {
        XVar2 = (*enc[3].scanners[1])(enc,ptr,pcVar8,ppcVar4);
        while( true ) {
          lVar5 = 2;
          while( true ) {
            iVar10 = iVar9;
            if (XVar2 == XML_CONVERT_COMPLETED) goto switchD_00487c47_caseD_8;
LAB_00487cc7:
            while( true ) {
              ptr = (char *)((long)ptr + lVar5);
              uVar3 = (long)end - (long)ptr;
              if ((long)uVar3 < 1) {
                return -1;
              }
              ppuVar6 = (unsigned_short **)(ulong)(byte)*ptr;
              bVar1 = *(byte *)((long)enc[1].scanners + (long)ppuVar6);
              if (bVar1 < 0x12) break;
              lVar5 = 1;
              if ((3 < bVar1 - 0x18) && (bVar1 != 0x16)) {
                iVar10 = iVar9;
                if (bVar1 == 0x12) {
                  ptr = (char *)((long)ptr + 1);
                  iVar10 = 0x1c;
                }
                goto switchD_00487c47_caseD_8;
              }
            }
            if (bVar1 == 5) break;
            if (bVar1 == 6) {
              if (uVar3 < 3) goto LAB_00487d83;
              XVar2 = (**(code **)&enc[2].minBytesPerChar)(enc,ptr);
LAB_00487d4d:
              lVar5 = 3;
            }
            else {
              iVar10 = iVar9;
              if (bVar1 != 7) goto switchD_00487c47_caseD_8;
              if (uVar3 < 4) goto LAB_00487d83;
              XVar2 = (*enc[3].scanners[0])(enc,ptr,(char *)(ulong)bVar1,(char **)ppuVar6);
LAB_00487d2b:
              lVar5 = 4;
            }
          }
          if (uVar3 == 1) break;
          XVar2 = (*enc[2].utf16Convert)(enc,(char **)ptr,(char *)(ulong)bVar1,ppuVar6,in_R8);
        }
LAB_00487d83:
        iVar10 = -2;
      }
      break;
    case 6:
      iVar10 = -2;
      if ((char **)0x2 < ppcVar4) {
        XVar2 = (*enc[3].scanners[2])(enc,ptr,pcVar8,ppcVar4);
        goto LAB_00487d4d;
      }
      break;
    case 7:
      iVar10 = -2;
      if ((char **)0x3 < ppcVar4) {
        XVar2 = (*enc[3].literalScanners[0])(enc,ptr,pcVar8,ppcVar4);
        goto LAB_00487d2b;
      }
      break;
    default:
      goto switchD_00487c47_caseD_8;
    case 9:
    case 10:
    case 0x15:
      goto switchD_00487c47_caseD_9;
    case 0x16:
    case 0x18:
      lVar5 = 1;
      goto LAB_00487cc7;
    }
  }
  else {
    iVar10 = iVar9;
    if (bVar1 == 0x1e) {
switchD_00487c47_caseD_9:
      iVar10 = 0x16;
    }
switchD_00487c47_caseD_8:
    *nextTokPtr = ptr;
  }
  return iVar10;
}

Assistant:

static int PTRCALL
PREFIX(scanPercent)(const ENCODING *enc, const char *ptr, const char *end,
                    const char **nextTokPtr)
{
  REQUIRE_CHAR(enc, ptr, end);
  switch (BYTE_TYPE(enc, ptr)) {
  CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
  case BT_S: case BT_LF: case BT_CR: case BT_PERCNT:
    *nextTokPtr = ptr;
    return XML_TOK_PERCENT;
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
    case BT_SEMI:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_PARAM_ENTITY_REF;
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}